

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O2

void write_binary<celle>(ofstream *f,field3d<celle> *data,
                        _func_double_field3d<celle>_ptr_int_int_int *get,int n0,int n,int ny,int nz)

{
  long lVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  void *pvVar5;
  int j;
  ulong uVar6;
  void *pvVar7;
  double dVar8;
  int k;
  
  uVar2 = (nz + ny) * (n - n0);
  uVar6 = 0xffffffffffffffff;
  if (-1 < (int)uVar2) {
    uVar6 = (ulong)uVar2 * 8;
  }
  pvVar3 = operator_new__(uVar6);
  lVar1 = (long)(nz + ny) * 8;
  pvVar5 = (void *)((long)pvVar3 + (long)ny * 8);
  pvVar7 = pvVar3;
  for (lVar4 = (long)n0; lVar4 < n; lVar4 = lVar4 + 1) {
    for (uVar6 = 0; (uint)(~(ny >> 0x1f) & ny) != uVar6; uVar6 = uVar6 + 1) {
      dVar8 = (*get)(data,(int)lVar4,(int)uVar6,nz / 2);
      *(double *)((long)pvVar7 + uVar6 * 8) = dVar8;
    }
    for (uVar6 = 0; (uint)(~(nz >> 0x1f) & nz) != uVar6; uVar6 = uVar6 + 1) {
      dVar8 = (*get)(data,(int)lVar4,ny / 2,(int)uVar6);
      *(double *)((long)pvVar5 + uVar6 * 8) = dVar8;
    }
    pvVar7 = (void *)((long)pvVar7 + lVar1);
    pvVar5 = (void *)((long)pvVar5 + lVar1);
  }
  std::ostream::write((char *)f,(long)pvVar3);
  operator_delete__(pvVar3);
  return;
}

Assistant:

void write_binary(ofstream* f, field3d<T> & data, double get(field3d<T>&,
            int, int, int), int n0, int n, int ny, int nz) {
    double* a = new double[(n - n0) * (ny + nz)]; /* for values in xy and xz
                                                     planes */
    for (int i = n0; i < n; ++i) {
        int k = nz / 2;
        for (int j = 0; j < ny; ++j)
            a[(i - n0) * (ny + nz) + j] = get(data, i, j, k);
        int j = ny / 2;
        for (int k = 0; k < nz; ++k)
            a[(i - n0) * (ny + nz) + ny + k] = get(data, i, j, k);
    }
    f->write(reinterpret_cast<char*>(a), sizeof(double) * (n - n0) * (ny +
                nz));
    delete[] a;
}